

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value bsim::operator^(quad_value *a,quad_value *b)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  quad_value *in_RSI;
  quad_value *in_RDI;
  uchar in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uchar local_1;
  
  bVar1 = quad_value::is_high_impedance(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!a.is_high_impedance()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0xcd,"quad_value bsim::operator^(const quad_value &, const quad_value &)");
  }
  bVar1 = quad_value::is_high_impedance(in_RSI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.is_high_impedance()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0xce,"quad_value bsim::operator^(const quad_value &, const quad_value &)");
  }
  bVar1 = quad_value::is_unknown(in_RDI);
  if ((bVar1) || (bVar1 = quad_value::is_unknown(in_RSI), bVar1)) {
    quad_value::quad_value
              ((quad_value *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdf);
    return (quad_value)local_1;
  }
  bVar1 = quad_value::is_binary(in_RDI);
  if (!bVar1) {
    __assert_fail("a.is_binary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0xd4,"quad_value bsim::operator^(const quad_value &, const quad_value &)");
  }
  bVar1 = quad_value::is_binary(in_RSI);
  if (bVar1) {
    bVar2 = quad_value::binary_value
                      ((quad_value *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    uVar3 = (uint)bVar2;
    quad_value::binary_value((quad_value *)(ulong)CONCAT14(bVar2,in_stack_ffffffffffffffe0));
    quad_value::quad_value
              ((quad_value *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdf);
    return (quad_value)local_1;
  }
  __assert_fail("b.is_binary()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0xd5,"quad_value bsim::operator^(const quad_value &, const quad_value &)");
}

Assistant:

static inline quad_value operator^(const quad_value& a,
                                     const quad_value& b) {
    assert(!a.is_high_impedance());
    assert(!b.is_high_impedance());

    if(a.is_unknown() || b.is_unknown()) {
      return quad_value(QBV_UNKNOWN_VALUE);
    }

    assert(a.is_binary());
    assert(b.is_binary());

    return quad_value(a.binary_value() ^ b.binary_value());

  }